

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_encoder.c
# Opt level: O3

aom_fixed_buf_t * aom_codec_get_global_headers(aom_codec_ctx_t *ctx)

{
  aom_codec_iface_t *paVar1;
  aom_codec_get_global_headers_fn_t_conflict UNRECOVERED_JUMPTABLE;
  aom_fixed_buf_t *paVar2;
  
  if (ctx != (aom_codec_ctx_t *)0x0) {
    paVar1 = ctx->iface;
    if ((paVar1 == (aom_codec_iface_t *)0x0) ||
       ((aom_codec_alg_priv_t_conflict *)ctx->priv == (aom_codec_alg_priv_t_conflict *)0x0)) {
      ctx->err = AOM_CODEC_ERROR;
    }
    else {
      if (((paVar1->caps & 2) != 0) &&
         (UNRECOVERED_JUMPTABLE = (paVar1->enc).get_glob_hdrs,
         UNRECOVERED_JUMPTABLE != (aom_codec_get_global_headers_fn_t_conflict)0x0)) {
        paVar2 = (*UNRECOVERED_JUMPTABLE)((aom_codec_alg_priv_t_conflict *)ctx->priv);
        return paVar2;
      }
      ctx->err = AOM_CODEC_INCAPABLE;
    }
  }
  return (aom_fixed_buf_t *)0x0;
}

Assistant:

aom_fixed_buf_t *aom_codec_get_global_headers(aom_codec_ctx_t *ctx) {
  aom_fixed_buf_t *buf = NULL;

  if (ctx) {
    if (!ctx->iface || !ctx->priv)
      ctx->err = AOM_CODEC_ERROR;
    else if (!(ctx->iface->caps & AOM_CODEC_CAP_ENCODER))
      ctx->err = AOM_CODEC_INCAPABLE;
    else if (!ctx->iface->enc.get_glob_hdrs)
      ctx->err = AOM_CODEC_INCAPABLE;
    else
      buf = ctx->iface->enc.get_glob_hdrs(get_alg_priv(ctx));
  }

  return buf;
}